

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

PolicyStatus __thiscall cmMakefile::GetPolicyStatus(cmMakefile *this,PolicyID id)

{
  PolicyStatus PVar1;
  PolicyStatus PVar2;
  
  PVar1 = GetPolicyStatusInternal(this,id);
  if (((PVar1 != NEW) && (1 < PVar1 - REQUIRED_IF_USED)) &&
     (PVar2 = cmPolicies::GetPolicyStatus(id), 0xfffffffd < PVar2 + ~REQUIRED_ALWAYS)) {
    return PVar2;
  }
  return PVar1;
}

Assistant:

cmPolicies::PolicyStatus
cmMakefile::GetPolicyStatus(cmPolicies::PolicyID id) const
{
  // Get the current setting of the policy.
  cmPolicies::PolicyStatus cur = this->GetPolicyStatusInternal(id);

  // If the policy is required to be set to NEW but is not, ignore the
  // current setting and tell the caller.
  if(cur != cmPolicies::NEW)
    {
    if(cur == cmPolicies::REQUIRED_ALWAYS ||
       cur == cmPolicies::REQUIRED_IF_USED)
      {
      return cur;
      }
    cmPolicies::PolicyStatus def = cmPolicies::GetPolicyStatus(id);
    if(def == cmPolicies::REQUIRED_ALWAYS ||
       def == cmPolicies::REQUIRED_IF_USED)
      {
      return def;
      }
    }

  // The current setting is okay.
  return cur;
}